

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_ptr.h
# Opt level: O3

void __thiscall booster::intrusive_ptr<mycall>::~intrusive_ptr(intrusive_ptr<mycall> *this)

{
  mycall *pmVar1;
  long lVar2;
  
  pmVar1 = this->p_;
  if (pmVar1 != (mycall *)0x0) {
    lVar2 = booster::atomic_counter::dec();
    if (lVar2 == 0) {
      (*(pmVar1->super_callable<void_()>).super_refcounted._vptr_refcounted[1])(pmVar1);
      return;
    }
  }
  return;
}

Assistant:

~intrusive_ptr()
    {
        if(p_ != 0) intrusive_ptr_release(p_);
    }